

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

bool __thiscall QDirListingPrivate::hasIterators(QDirListingPrivate *this)

{
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  *pvVar1;
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  *pvVar2;
  bool bVar3;
  
  bVar3 = (this->engine)._M_t.
          super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t
          .super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
          super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
          (QAbstractFileEngine *)0x0;
  pvVar2 = &this->fileEngineIterators;
  if (bVar3) {
    pvVar2 = (vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
              *)&this->nativeIterators;
  }
  pvVar1 = (vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
            *)&this->nativeIterators;
  if (!bVar3) {
    pvVar1 = &this->fileEngineIterators;
  }
  return (pvVar2->
         super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start !=
         (pvVar1->
         super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool QDirListingPrivate::hasIterators() const
{
    if (engine)
        return !fileEngineIterators.empty();

#if !defined(QT_NO_FILESYSTEMITERATOR)
    return !nativeIterators.empty();
#endif

    return false;
}